

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O3

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
ResponseBase::extractTokensFromLine
          (set<Token,_std::less<Token>,_std::allocator<Token>_> *__return_storage_ptr__,
          ResponseBase *this,string *line)

{
  _Rb_tree_header *p_Var1;
  ResponseBase *this_00;
  ulong uVar2;
  undefined1 local_98 [8];
  set<Token,_std::less<Token>,_std::allocator<Token>_> std_tokens;
  set<Token,_std::less<Token>,_std::allocator<Token>_> header_tokens;
  
  header_tokens._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  uVar2 = std::__cxx11::string::find((char *)line,0x1ebd54,0);
  this_00 = (ResponseBase *)header_tokens._M_t._M_impl.super__Rb_tree_header._M_node_count;
  while (header_tokens._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00,
        uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)line,uVar2,(char *)0x2,0x1ebd70);
    uVar2 = std::__cxx11::string::find((char *)line,0x1ebd54,uVar2 + 1);
    this_00 = (ResponseBase *)header_tokens._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  extractStdTokensFromLine
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)local_98,this_00,line);
  std::_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>::
  _M_insert_range_unique<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
            ((_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>> *)
             __return_storage_ptr__,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             std_tokens._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)&std_tokens);
  extractHeaderTokensFromLine
            ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)
             &std_tokens._M_t._M_impl.super__Rb_tree_header._M_node_count,this_00,line);
  std::_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>>::
  _M_insert_range_unique<std::move_iterator<std::_Rb_tree_const_iterator<Token>>>
            ((_Rb_tree<Token,Token,std::_Identity<Token>,std::less<Token>,std::allocator<Token>> *)
             __return_storage_ptr__,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)
             header_tokens._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (move_iterator<std::_Rb_tree_const_iterator<Token>_>)&header_tokens);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
             *)&std_tokens._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
             *)local_98);
  return __return_storage_ptr__;
}

Assistant:

std::set<Token> extractTokensFromLine(std::string line) const { // TODO needs some love
        str::replace_all(line, "\\_", "_");

        std::set<Token> tokens;

        std::set<Token> std_tokens = extractStdTokensFromLine(line);
        tokens.insert(std::make_move_iterator(std_tokens.begin()), std::make_move_iterator(std_tokens.end()));

        std::set<Token> header_tokens = extractHeaderTokensFromLine(line);
        tokens.insert(std::make_move_iterator(header_tokens.begin()), std::make_move_iterator(header_tokens.end()));

        return tokens;
    }